

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool calculateSimilartyMap<stSampleMulti<short,4>>
               (int32_t keyPressWidth_samples,int32_t alignWindow_samples,
               int32_t offsetFromPeak_samples,TKeyPressCollectionT<TSampleMI16> *keyPresses,
               TSimilarityMap *res)

{
  pointer pvVar1;
  TSimilarityMap *__range1;
  pointer *__ptr;
  iterator __begin1;
  pointer ptVar2;
  vector<stMatch,_std::allocator<stMatch>_> *x;
  pointer this;
  long lVar3;
  int iVar4;
  long lVar5;
  long *local_78;
  int nWorkers;
  int a;
  int w;
  int nPresses;
  int32_t offsetFromPeak_samples_local;
  TKeyPressCollectionT<TSampleMI16> *local_58;
  thread local_50;
  vector<std::thread,_std::allocator<std::thread>_> workers;
  
  iVar4 = (int)(((long)(keyPresses->
                       super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                       ).
                       super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(keyPresses->
                      super_vector<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                      ).
                      super__Vector_base<stKeyPressData<stSampleMulti<short,_4>_>,_std::allocator<stKeyPressData<stSampleMulti<short,_4>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x30);
  a = alignWindow_samples;
  w = keyPressWidth_samples;
  nPresses = iVar4;
  offsetFromPeak_samples_local = offsetFromPeak_samples;
  local_58 = keyPresses;
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::clear(res);
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::resize(res,(long)iVar4);
  pvVar1 = (res->
           super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (this = (res->
              super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start; this != pvVar1; this = this + 1) {
    std::vector<stMatch,_std::allocator<stMatch>_>::resize(this,(long)iVar4);
  }
  nWorkers = std::thread::hardware_concurrency();
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&workers,(long)nWorkers,(allocator_type *)&local_78);
  lVar5 = 0;
  lVar3 = 0;
  while( true ) {
    ptVar2 = workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar3) break;
    local_50._M_id._M_thread = (id)0;
    local_78 = (long *)operator_new(0x48);
    *local_78 = (long)&PTR___State_00137d38;
    *(int *)(local_78 + 1) = (int)lVar3;
    local_78[2] = (long)&nPresses;
    local_78[3] = (long)&nWorkers;
    local_78[4] = (long)res;
    local_78[5] = (long)local_58;
    local_78[6] = (long)&offsetFromPeak_samples_local;
    local_78[7] = (long)&w;
    local_78[8] = (long)&a;
    std::thread::_M_start_thread(&local_50,&local_78,0);
    if (local_78 != (long *)0x0) {
      (**(code **)(*local_78 + 8))();
    }
    std::thread::operator=((thread *)((long)&(ptVar2->_M_id)._M_thread + lVar5),&local_50);
    std::thread::~thread(&local_50);
    lVar3 = lVar3 + 1;
    lVar5 = lVar5 + 8;
  }
  for (; ptVar2 != workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish; ptVar2 = ptVar2 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&workers);
  return true;
}

Assistant:

bool calculateSimilartyMap(
        const int32_t keyPressWidth_samples,
        const int32_t alignWindow_samples,
        const int32_t offsetFromPeak_samples,
        TKeyPressCollectionT<TSampleMI16> & keyPresses,
        TSimilarityMap & res) {
    int nPresses = keyPresses.size();

    int w = keyPressWidth_samples;
    int a = alignWindow_samples;

    res.clear();
    res.resize(nPresses);
    for (auto & x : res) x.resize(nPresses);

#ifdef __EMSCRIPTEN__
    int nWorkers = std::min(kMaxThreads, std::max(1, int(std::thread::hardware_concurrency()) - 2));
#else
    int nWorkers = std::thread::hardware_concurrency();
#endif

    std::vector<std::thread> workers(nWorkers);
    for (int iw = 0; iw < (int) workers.size(); ++iw) {
        auto & worker = workers[iw];
        worker = std::thread([&](int ith) {
            for (int i = ith; i < nPresses; i += nWorkers) {
                res[i][i].cc = 1.0f;
                res[i][i].offset = 0;

                const auto & waveform0 = keyPresses[i].waveform;
                const auto & pos0      = keyPresses[i].pos;

                auto & avgcc = keyPresses[i].ccAvg;

                const auto samples0 = waveform0.samples;

                for (int j = i + 1; j < nPresses; ++j) {
                    if (i == j) continue;

                    const auto waveform1 = keyPresses[j].waveform;
                    const auto pos1      = keyPresses[j].pos;

                    const auto samples1 = waveform1.samples;
                    const auto ret = findBestCC(TWaveformViewT<TSampleMI16> { samples0 + pos0 + offsetFromPeak_samples - w,     2*w },
                                                TWaveformViewT<TSampleMI16> { samples1 + pos1 + offsetFromPeak_samples - w - a, 2*w + 2*a }, a);

                    const auto bestcc     = std::get<0>(ret);
                    const auto bestoffset = std::get<1>(ret);

                    res[i][j].cc = bestcc;
                    res[i][j].offset = bestoffset;

                    res[j][i].cc = bestcc;
                    res[j][i].offset = -bestoffset;

                    avgcc += bestcc;
                }
                avgcc /= (nPresses - 1);
            }
        }, iw);
    }

    for (auto & worker : workers) worker.join();

    return true;
}